

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

int Cudd_RemoveHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  int iVar1;
  DdHook **ppDVar2;
  DdHook *pDVar3;
  DdHook *__ptr;
  
  iVar1 = 0;
  if (where < 4) {
    __ptr = (&dd->preGCHook)[where];
    if (__ptr != (DdHook *)0x0) {
      if (__ptr->f == f) {
        ppDVar2 = &dd->preGCHook + where;
      }
      else {
        do {
          pDVar3 = __ptr;
          __ptr = pDVar3->next;
          if (__ptr == (DdHook *)0x0) {
            return 0;
          }
        } while (__ptr->f != f);
        ppDVar2 = &pDVar3->next;
      }
      *ppDVar2 = __ptr->next;
      free(__ptr);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
Cudd_RemoveHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook **hook, *nextHook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = &(dd->preGCHook);
        break;
    case CUDD_POST_GC_HOOK:
        hook = &(dd->postGCHook);
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = &(dd->preReorderingHook);
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = &(dd->postReorderingHook);
        break;
    default:
        return(0);
    }
    nextHook = *hook;
    while (nextHook != NULL) {
        if (nextHook->f == f) {
            *hook = nextHook->next;
            ABC_FREE(nextHook);
            return(1);
        }
        hook = &(nextHook->next);
        nextHook = nextHook->next;
    }

    return(0);

}